

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,AlphaNum *f)

{
  pointer __dest;
  size_t sVar1;
  string *psVar2;
  LogMessage *other;
  pointer pcVar3;
  LogFinisher local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string *local_70;
  LogMessage local_68;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)a->piece_size_ + (char)*(undefined8 *)(this + 8) + (char)b->piece_size_ +
             (char)c->piece_size_ + (char)d->piece_size_ + (char)e->piece_size_);
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_70 = __return_storage_ptr__;
  memcpy(__dest,*(void **)this,*(size_t *)(this + 8));
  pcVar3 = __dest + *(long *)(this + 8);
  memcpy(pcVar3,a->piece_data_,a->piece_size_);
  pcVar3 = pcVar3 + a->piece_size_;
  memcpy(pcVar3,b->piece_data_,b->piece_size_);
  pcVar3 = pcVar3 + b->piece_size_;
  memcpy(pcVar3,c->piece_data_,c->piece_size_);
  pcVar3 = pcVar3 + c->piece_size_;
  memcpy(pcVar3,d->piece_data_,d->piece_size_);
  sVar1 = d->piece_size_;
  memcpy(pcVar3 + sVar1,e->piece_data_,e->piece_size_);
  psVar2 = local_70;
  if (pcVar3 + sVar1 + e->piece_size_ != __dest + local_70->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x5f4);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_79,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return psVar2;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d, const AlphaNum &e, const AlphaNum &f) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append2(out, e, f);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}